

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O3

int run_test_fs_poll_getpath(void)

{
  uv_loop_t *loop;
  int iVar1;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  int64_t eval_b_1;
  int64_t eval_a_1;
  size_t len;
  char buf [1024];
  undefined8 local_410;
  long local_408 [128];
  
  ::loop = uv_default_loop();
  remove("testfile");
  iVar1 = uv_fs_poll_init(::loop,&poll_handle);
  local_408[0] = (long)iVar1;
  local_410 = 0;
  if (local_408[0] == 0) {
    local_410 = 0x400;
    iVar1 = uv_fs_poll_getpath(&poll_handle,(char *)local_408,&local_410);
    if (iVar1 != -0x16) goto LAB_001872d9;
    iVar1 = uv_fs_poll_start(&poll_handle,poll_cb_fail,"testfile",100);
    if (iVar1 != 0) goto LAB_001872e8;
    local_410 = 0x400;
    iVar1 = uv_fs_poll_getpath(&poll_handle,(char *)local_408,&local_410);
    if (iVar1 != 0) goto LAB_001872f7;
    if (*(char *)((long)local_408 + (local_410 - 1)) == '\0') goto LAB_00187306;
    if (*(char *)((long)local_408 + local_410) != '\0') goto LAB_00187315;
    iVar1 = memcmp(local_408,"testfile",local_410);
    if (iVar1 != 0) goto LAB_00187324;
    uv_close((uv_handle_t *)&poll_handle,close_cb);
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    loop = ::loop;
    if (iVar1 != 0) goto LAB_00187333;
    if (close_cb_called == 1) {
      uv_walk(::loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      iVar1 = uv_loop_close(::loop);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00187351;
    }
  }
  else {
    run_test_fs_poll_getpath_cold_1();
LAB_001872d9:
    run_test_fs_poll_getpath_cold_2();
LAB_001872e8:
    run_test_fs_poll_getpath_cold_3();
LAB_001872f7:
    run_test_fs_poll_getpath_cold_4();
LAB_00187306:
    run_test_fs_poll_getpath_cold_10();
LAB_00187315:
    run_test_fs_poll_getpath_cold_5();
LAB_00187324:
    run_test_fs_poll_getpath_cold_6();
LAB_00187333:
    run_test_fs_poll_getpath_cold_7();
  }
  run_test_fs_poll_getpath_cold_8();
LAB_00187351:
  run_test_fs_poll_getpath_cold_9();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
          ,0x58,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(fs_poll_getpath) {
  char buf[1024];
  size_t len;
  loop = uv_default_loop();

  remove(FIXTURE);

  ASSERT_OK(uv_fs_poll_init(loop, &poll_handle));
  len = sizeof buf;
  ASSERT_EQ(UV_EINVAL, uv_fs_poll_getpath(&poll_handle, buf, &len));
  ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  len = sizeof buf;
  ASSERT_OK(uv_fs_poll_getpath(&poll_handle, buf, &len));
  ASSERT_NE(0, buf[len - 1]);
  ASSERT_EQ(buf[len], '\0');
  ASSERT_OK(memcmp(buf, FIXTURE, len));

  uv_close((uv_handle_t*) &poll_handle, close_cb);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}